

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O0

asn_dec_rval_t
SET_OF_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 char *opt_mname,void *buf_ptr,size_t size)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  xer_check_tag_e xVar4;
  short *psVar5;
  pxer_chunk_type_e *ppVar6;
  char *in_RCX;
  long *in_RDX;
  void *extraout_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long in_R8;
  long in_R9;
  asn_dec_rval_t aVar7;
  size_t num_4;
  size_t num_3;
  size_t num_2;
  size_t num_1;
  size_t num;
  asn_anonymous_set_ *list;
  asn_dec_rval_t tmprval;
  xer_check_tag_e tcv;
  ssize_t ch_size;
  pxer_chunk_type_e ch_type;
  ssize_t consumed_myself;
  asn_struct_ctx_t *ctx;
  void *st;
  char *xml_tag;
  char *elm_tag;
  asn_TYPE_member_t *element;
  asn_SET_OF_specifics_t *specs;
  asn_dec_rval_t rval;
  char *in_stack_ffffffffffffff10;
  char *need_tag;
  pxer_chunk_type_e *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  pxer_chunk_type_e *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  int local_7c;
  size_t local_78;
  int *local_68;
  char *local_58;
  long local_40;
  long local_38;
  uint local_10;
  size_t local_8;
  
  piVar1 = *(int **)(in_RSI + 0x98);
  lVar2 = *(long *)(in_RSI + 0x88);
  if (in_RCX == (char *)0x0) {
    in_RCX = *(char **)(in_RSI + 8);
  }
  local_68 = (int *)*in_RDX;
  local_78 = 0;
  need_tag = in_RCX;
  if (local_68 == (int *)0x0) {
    local_68 = (int *)calloc(1,(long)*piVar1);
    *in_RDX = (long)local_68;
    if (local_68 == (int *)0x0) {
      local_10 = 2;
      local_8 = 0;
      goto LAB_0015febf;
    }
  }
  if (piVar1[2] == 0) {
    if (**(char **)(lVar2 + 0x38) == '\0') {
      in_stack_ffffffffffffff10 = *(char **)(*(long *)(lVar2 + 0x18) + 8);
      local_58 = in_stack_ffffffffffffff10;
    }
    else {
      in_stack_ffffffffffffff10 = *(char **)(lVar2 + 0x38);
      local_58 = in_stack_ffffffffffffff10;
    }
  }
  else {
    local_58 = "";
    if (piVar1[2] == 1) {
      local_58 = (char *)0x0;
    }
  }
  psVar5 = (short *)((long)local_68 + (long)piVar1[1]);
  local_40 = in_R9;
  local_38 = in_R8;
LAB_0015f9b9:
  while (*psVar5 < 3) {
    if (*psVar5 == 2) {
      ASN_DEBUG("XER/SET OF element [%s]",local_58);
      local_10 = (**(code **)(*(long *)(lVar2 + 0x18) + 0x38))
                           (in_RDI,*(undefined8 *)(lVar2 + 0x18),psVar5 + 4,local_58,local_38,
                            local_40);
      if (local_10 != 0) {
        local_8 = (long)extraout_RDX + local_78;
        goto LAB_0015febf;
      }
      in_stack_ffffffffffffff48 = local_68;
      iVar3 = asn_set_add(need_tag,in_stack_ffffffffffffff10);
      if (iVar3 != 0) {
        local_10 = 2;
        local_8 = local_78;
        goto LAB_0015febf;
      }
      psVar5[4] = 0;
      psVar5[5] = 0;
      psVar5[6] = 0;
      psVar5[7] = 0;
      local_38 = local_38 + (long)extraout_RDX;
      local_40 = local_40 - (long)extraout_RDX;
      local_78 = (long)extraout_RDX + local_78;
      *psVar5 = 1;
      in_stack_ffffffffffffff40 = extraout_RDX;
      ASN_DEBUG("XER/SET OF phase => %d",(ulong)(uint)(int)*psVar5);
    }
    ppVar6 = (pxer_chunk_type_e *)
             xer_next_token(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if (ppVar6 == (pxer_chunk_type_e *)0xffffffffffffffff) {
      local_10 = 2;
      local_8 = local_78;
      goto LAB_0015febf;
    }
    if (local_7c == 0) {
      local_10 = 1;
      local_8 = local_78;
      goto LAB_0015febf;
    }
    if ((local_7c == 1) || (1 < local_7c - 2U)) {
      xVar4 = xer_check_tag(in_stack_ffffffffffffff28,
                            (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),need_tag);
      ASN_DEBUG("XER/SET OF: tcv = %d, ph=%d t=%s",(ulong)xVar4,(ulong)(uint)(int)*psVar5,in_RCX);
      switch(xVar4) {
      case XCT_OPENING:
        goto switchD_0015fd1d_caseD_1;
      case XCT_CLOSING:
        if (*psVar5 != 0) {
          *psVar5 = 0;
          goto switchD_0015fd1d_caseD_3;
        }
        goto LAB_0015fe89;
      case XCT_BOTH:
        goto switchD_0015fd1d_caseD_3;
      default:
        goto switchD_0015fd1d_caseD_4;
      case XCT_UNKNOWN_OP:
      case XCT_UNKNOWN_BO:
        goto switchD_0015fd1d_caseD_5;
      }
    }
    local_38 = local_38 + (long)ppVar6;
    local_40 = local_40 - (long)ppVar6;
    local_78 = (long)ppVar6 + local_78;
    in_stack_ffffffffffffff30 = ppVar6;
  }
LAB_0015fe97:
  *psVar5 = 3;
  local_10 = 2;
  local_8 = local_78;
LAB_0015febf:
  aVar7._4_4_ = 0;
  aVar7.code = local_10;
  aVar7.consumed = local_8;
  return aVar7;
switchD_0015fd1d_caseD_3:
  if (*psVar5 == 0) {
    local_8 = (long)ppVar6 + local_78;
    *psVar5 = 3;
    local_10 = 0;
    goto LAB_0015febf;
  }
switchD_0015fd1d_caseD_1:
  if (*psVar5 == 0) {
    local_38 = local_38 + (long)ppVar6;
    local_40 = local_40 - (long)ppVar6;
    local_78 = (long)ppVar6 + local_78;
    *psVar5 = 1;
    in_stack_ffffffffffffff20 = ppVar6;
  }
  else {
switchD_0015fd1d_caseD_5:
    ASN_DEBUG("XER/SET OF: tcv=%d, ph=%d",(ulong)xVar4,(ulong)(uint)(int)*psVar5);
    if (*psVar5 != 1) {
switchD_0015fd1d_caseD_4:
LAB_0015fe89:
      ASN_DEBUG("Unexpected XML tag in SET OF");
      goto LAB_0015fe97;
    }
    *psVar5 = 2;
  }
  goto LAB_0015f9b9;
}

Assistant:

asn_dec_rval_t
SET_OF_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *element = td->elements;
	const char *elm_tag;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * ... and parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value from a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/* Which tag is expected for the downstream */
	if(specs->as_XMLValueList) {
		elm_tag = (specs->as_XMLValueList == 1) ? 0 : "";
	} else {
		elm_tag = (*element->name)
				? element->name : element->type->xml_tag;
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);

	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 */
	for(; ctx->phase <= 2;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */

		/*
		 * Go inside the inner member of a set.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;

			/* Invoke the inner type decoder, m.b. multiple times */
			ASN_DEBUG("XER/SET OF element [%s]", elm_tag);
			tmprval = element->type->xer_decoder(opt_codec_ctx,
					element->type, &ctx->ptr, elm_tag,
					buf_ptr, size);
			if(tmprval.code == RC_OK) {
				asn_anonymous_set_ *list = _A_SET_FROM_VOID(st);
				if(ASN_SET_ADD(list, ctx->ptr) != 0)
					RETURN(RC_FAIL);
				ctx->ptr = 0;
				XER_ADVANCE(tmprval.consumed);
			} else {
				XER_ADVANCE(tmprval.consumed);
				RETURN(tmprval.code);
			}
			ctx->phase = 1;	/* Back to body processing */
			ASN_DEBUG("XER/SET OF phase => %d", ctx->phase);
			/* Fall through */
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context,
			buf_ptr, size, &ch_type);
		if(ch_size == -1) {
            RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
            case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/SET OF: tcv = %d, ph=%d t=%s",
			tcv, ctx->phase, xml_tag);
		switch(tcv) {
		case XCT_CLOSING:
			if(ctx->phase == 0) break;
			ctx->phase = 0;
			/* Fall through */
		case XCT_BOTH:
			if(ctx->phase == 0) {
				/* No more things to decode */
				XER_ADVANCE(ch_size);
				ctx->phase = 3;	/* Phase out */
				RETURN(RC_OK);
			}
			/* Fall through */
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			ASN_DEBUG("XER/SET OF: tcv=%d, ph=%d", tcv, ctx->phase);
			if(ctx->phase == 1) {
				/*
				 * Process a single possible member.
				 */
				ctx->phase = 2;
				continue;
			}
			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag in SET OF");
		break;
	}

	ctx->phase = 3;	/* "Phase out" on hard failure */
	RETURN(RC_FAIL);
}